

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

void __thiscall Indexing::CodeTree::SearchStruct::destroy(SearchStruct *this)

{
  void *in_RDI;
  uint in_stack_fffffffffffffff0;
  
  if (*(int *)((long)in_RDI + 0x10) == 0) {
    if (in_RDI != (void *)0x0) {
      SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)0>::~SearchStructImpl
                ((SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)0> *)
                 (ulong)in_stack_fffffffffffffff0);
      ::operator_delete(in_RDI,0x48);
    }
  }
  else if ((*(int *)((long)in_RDI + 0x10) == 1) && (in_RDI != (void *)0x0)) {
    SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)1>::~SearchStructImpl
              ((SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)1> *)
               CONCAT44(1,in_stack_fffffffffffffff0));
    ::operator_delete(in_RDI,0x48);
  }
  return;
}

Assistant:

void CodeTree::SearchStruct::destroy()
{
  switch(kind) {
  case FN_STRUCT:
    delete static_cast<FnSearchStruct*>(this);
    break;
  case GROUND_TERM_STRUCT:
    delete static_cast<GroundTermSearchStruct*>(this);
    break;
  }
}